

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O0

void SafeCopyCStr(char *dest,size_t destBytes,char *src)

{
  char *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  
  strncpy(in_RDI,in_RDX,in_RSI);
  in_RDI[in_RSI - 1] = '\0';
  return;
}

Assistant:

static void SafeCopyCStr(char* dest, size_t destBytes, const char* src)
{
#if defined(_MSC_VER)
    strncpy_s(dest, destBytes, src, _TRUNCATE);
#else // _MSC_VER
    strncpy(dest, src, destBytes);
#endif // _MSC_VER
    // No null-character is implicitly appended at the end of destination
    dest[destBytes - 1] = '\0';
}